

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimSnapshotManager.cpp
# Opt level: O0

void __thiscall
OpenMD::SimSnapshotManager::SimSnapshotManager
          (SimSnapshotManager *this,SimInfo *info,int atomStorageLayout,int rigidBodyStorageLayout,
          int cutoffGroupStorageLayout)

{
  Snapshot *pSVar1;
  int in_ECX;
  int in_EDX;
  _func_int **in_RSI;
  SnapshotManager *in_RDI;
  int in_R8D;
  bool usePBC;
  int nCutoffGroups;
  int nRigidBodies;
  int nAtoms;
  undefined1 in_stack_000002ab;
  int in_stack_000002ac;
  int in_stack_000002b0;
  int in_stack_000002b4;
  int in_stack_000002b8;
  int in_stack_000002bc;
  Snapshot *in_stack_000002c0;
  int in_stack_000002d0;
  
  SnapshotManager::SnapshotManager(in_RDI,in_EDX,in_ECX,in_R8D);
  in_RDI->_vptr_SnapshotManager = (_func_int **)&PTR__SimSnapshotManager_0033f550;
  in_RDI[1]._vptr_SnapshotManager = in_RSI;
  SimInfo::getNAtoms((SimInfo *)in_RDI[1]._vptr_SnapshotManager);
  SimInfo::getNRigidBodies((SimInfo *)in_RDI[1]._vptr_SnapshotManager);
  SimInfo::getNCutoffGroups((SimInfo *)in_RDI[1]._vptr_SnapshotManager);
  SimInfo::getSimParams((SimInfo *)in_RDI[1]._vptr_SnapshotManager);
  Globals::getUsePeriodicBoundaryConditions((Globals *)0x1d9185);
  pSVar1 = (Snapshot *)operator_new(0xa98);
  Snapshot::Snapshot(in_stack_000002c0,in_stack_000002bc,in_stack_000002b8,in_stack_000002b4,
                     in_stack_000002b0,in_stack_000002ac,in_stack_000002d0,(bool)in_stack_000002ab);
  in_RDI->previousSnapshot_ = pSVar1;
  pSVar1 = (Snapshot *)operator_new(0xa98);
  Snapshot::Snapshot(in_stack_000002c0,in_stack_000002bc,in_stack_000002b8,in_stack_000002b4,
                     in_stack_000002b0,in_stack_000002ac,in_stack_000002d0,(bool)in_stack_000002ab);
  in_RDI->currentSnapshot_ = pSVar1;
  return;
}

Assistant:

SimSnapshotManager::SimSnapshotManager(SimInfo* info, int atomStorageLayout,
                                         int rigidBodyStorageLayout,
                                         int cutoffGroupStorageLayout) :
      SnapshotManager(atomStorageLayout, rigidBodyStorageLayout,
                      cutoffGroupStorageLayout),
      info_(info) {
    int nAtoms        = info_->getNAtoms();
    int nRigidBodies  = info_->getNRigidBodies();
    int nCutoffGroups = info_->getNCutoffGroups();
    bool usePBC = info_->getSimParams()->getUsePeriodicBoundaryConditions();

    // allocate memory for snapshots
    previousSnapshot_ =
        new Snapshot(nAtoms, nRigidBodies, nCutoffGroups, atomStorageLayout,
                     rigidBodyStorageLayout, cutoffGroupStorageLayout, usePBC);
    currentSnapshot_ =
        new Snapshot(nAtoms, nRigidBodies, nCutoffGroups, atomStorageLayout,
                     rigidBodyStorageLayout, cutoffGroupStorageLayout, usePBC);
  }